

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::ForEachUser
          (DefUseManager *this,Instruction *def,function<void_(spvtools::opt::Instruction_*)> *f)

{
  anon_class_8_1_54a39806 local_48;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  function<void_(spvtools::opt::Instruction_*)> *local_20;
  function<void_(spvtools::opt::Instruction_*)> *f_local;
  Instruction *def_local;
  DefUseManager *this_local;
  
  local_48.f = f;
  local_20 = f;
  f_local = (function<void_(spvtools::opt::Instruction_*)> *)def;
  def_local = (Instruction *)this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::analysis::DefUseManager::ForEachUser(spvtools::opt::Instruction_const*,std::function<void(spvtools::opt::Instruction*)>const&)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_48);
  WhileEachUser(this,def,&local_40);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void DefUseManager::ForEachUser(
    const Instruction* def, const std::function<void(Instruction*)>& f) const {
  WhileEachUser(def, [&f](Instruction* user) {
    f(user);
    return true;
  });
}